

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_array_cmp_generic(void *a,void *b,void *opaque)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [11];
  undefined1 auVar6 [12];
  undefined1 auVar7 [13];
  undefined1 auVar8 [14];
  JSValue val_00;
  JSValue this_obj;
  JSValue func_obj;
  int iVar9;
  long in_RDX;
  char *in_RSI;
  char *in_RDI;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  byte bVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  undefined1 uVar30;
  char cVar31;
  undefined1 uVar32;
  char cVar33;
  undefined1 uVar34;
  JSValue JVar35;
  JSValue str_1;
  JSValue str;
  double val_1;
  int val;
  int cmp;
  ValueSlot *bp;
  ValueSlot *ap;
  JSValue res;
  JSValue argv [2];
  JSContext *ctx;
  array_sort_context *psc;
  JSValueUnion in_stack_ffffffffffffff28;
  JSValueUnion in_stack_ffffffffffffff30;
  JSContext *in_stack_ffffffffffffff38;
  JSValueUnion ctx_00;
  JSValue in_stack_ffffffffffffff40;
  double local_b0;
  int in_stack_ffffffffffffff5c;
  uint in_stack_ffffffffffffff64;
  int64_t in_stack_ffffffffffffff70;
  int iVar36;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int local_68;
  JSValue *in_stack_ffffffffffffffa0;
  
  ctx_00 = in_stack_ffffffffffffff40.u;
  if (*(int *)(in_RDX + 8) != 0) {
    return 0;
  }
  if (*(int *)(in_RDX + 0xc) == 0) {
    if (*(long *)(in_RDI + 0x10) == 0) {
      JVar35.tag = (int64_t)in_stack_ffffffffffffff30.ptr;
      JVar35.u.ptr = in_stack_ffffffffffffff28.ptr;
      JVar35 = JS_ToString((JSContext *)0x1b3d54,JVar35);
      ctx_00 = JVar35.u;
      iVar9 = JS_IsException(JVar35);
      if (iVar9 != 0) goto LAB_001b3e54;
      ((JSValueUnion *)(in_RDI + 0x10))->ptr = (void *)ctx_00;
    }
    if (*(long *)(in_RSI + 0x10) == 0) {
      val_00.tag = (int64_t)in_stack_ffffffffffffff30.ptr;
      val_00.u.ptr = in_stack_ffffffffffffff28.ptr;
      JVar35 = JS_ToString((JSContext *)0x1b3daa,val_00);
      in_stack_ffffffffffffff30 = JVar35.u;
      in_stack_ffffffffffffff38 = (JSContext *)JVar35.tag;
      iVar9 = JS_IsException(JVar35);
      if (iVar9 != 0) goto LAB_001b3e54;
      ((JSValueUnion *)(in_RSI + 0x10))->ptr = (void *)in_stack_ffffffffffffff30;
    }
    iVar9 = js_string_compare((JSContext *)ctx_00.ptr,(JSString *)in_stack_ffffffffffffff38,
                              (JSString *)in_stack_ffffffffffffff30.ptr);
  }
  else {
    cVar24 = *in_RSI;
    cVar25 = in_RSI[1];
    cVar26 = in_RSI[2];
    cVar27 = in_RSI[3];
    cVar28 = in_RSI[4];
    cVar29 = in_RSI[5];
    cVar31 = in_RSI[6];
    cVar33 = in_RSI[7];
    cVar10 = -(in_RDI[2] == cVar26);
    cVar11 = -(in_RDI[3] == cVar27);
    cVar12 = -(in_RDI[4] == cVar28);
    cVar13 = -(in_RDI[5] == cVar29);
    cVar14 = -(in_RDI[6] == cVar31);
    cVar15 = -(in_RDI[7] == cVar33);
    cVar16 = -(in_RDI[8] == in_RSI[8]);
    cVar17 = -(in_RDI[9] == in_RSI[9]);
    cVar18 = -(in_RDI[10] == in_RSI[10]);
    cVar19 = -(in_RDI[0xb] == in_RSI[0xb]);
    cVar20 = -(in_RDI[0xc] == in_RSI[0xc]);
    cVar21 = -(in_RDI[0xd] == in_RSI[0xd]);
    cVar22 = -(in_RDI[0xe] == in_RSI[0xe]);
    bVar23 = -(in_RDI[0xf] == in_RSI[0xf]);
    auVar1[1] = -(in_RDI[1] == cVar25);
    auVar1[0] = -(*in_RDI == cVar24);
    auVar1[2] = cVar10;
    auVar1[3] = cVar11;
    auVar1[4] = cVar12;
    auVar1[5] = cVar13;
    auVar1[6] = cVar14;
    auVar1[7] = cVar15;
    auVar1[8] = cVar16;
    auVar1[9] = cVar17;
    auVar1[10] = cVar18;
    auVar1[0xb] = cVar19;
    auVar1[0xc] = cVar20;
    auVar1[0xd] = cVar21;
    auVar1[0xe] = cVar22;
    auVar1[0xf] = bVar23;
    auVar2[1] = -(in_RDI[1] == cVar25);
    auVar2[0] = -(*in_RDI == cVar24);
    auVar2[2] = cVar10;
    auVar2[3] = cVar11;
    auVar2[4] = cVar12;
    auVar2[5] = cVar13;
    auVar2[6] = cVar14;
    auVar2[7] = cVar15;
    auVar2[8] = cVar16;
    auVar2[9] = cVar17;
    auVar2[10] = cVar18;
    auVar2[0xb] = cVar19;
    auVar2[0xc] = cVar20;
    auVar2[0xd] = cVar21;
    auVar2[0xe] = cVar22;
    auVar2[0xf] = bVar23;
    auVar8[1] = cVar11;
    auVar8[0] = cVar10;
    auVar8[2] = cVar12;
    auVar8[3] = cVar13;
    auVar8[4] = cVar14;
    auVar8[5] = cVar15;
    auVar8[6] = cVar16;
    auVar8[7] = cVar17;
    auVar8[8] = cVar18;
    auVar8[9] = cVar19;
    auVar8[10] = cVar20;
    auVar8[0xb] = cVar21;
    auVar8[0xc] = cVar22;
    auVar8[0xd] = bVar23;
    auVar7[1] = cVar12;
    auVar7[0] = cVar11;
    auVar7[2] = cVar13;
    auVar7[3] = cVar14;
    auVar7[4] = cVar15;
    auVar7[5] = cVar16;
    auVar7[6] = cVar17;
    auVar7[7] = cVar18;
    auVar7[8] = cVar19;
    auVar7[9] = cVar20;
    auVar7[10] = cVar21;
    auVar7[0xb] = cVar22;
    auVar7[0xc] = bVar23;
    auVar6[1] = cVar13;
    auVar6[0] = cVar12;
    auVar6[2] = cVar14;
    auVar6[3] = cVar15;
    auVar6[4] = cVar16;
    auVar6[5] = cVar17;
    auVar6[6] = cVar18;
    auVar6[7] = cVar19;
    auVar6[8] = cVar20;
    auVar6[9] = cVar21;
    auVar6[10] = cVar22;
    auVar6[0xb] = bVar23;
    auVar5[1] = cVar14;
    auVar5[0] = cVar13;
    auVar5[2] = cVar15;
    auVar5[3] = cVar16;
    auVar5[4] = cVar17;
    auVar5[5] = cVar18;
    auVar5[6] = cVar19;
    auVar5[7] = cVar20;
    auVar5[8] = cVar21;
    auVar5[9] = cVar22;
    auVar5[10] = bVar23;
    if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB141(auVar8 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar7 >> 7,0) & 1) << 3
                 | (ushort)(SUB121(auVar6 >> 7,0) & 1) << 4 |
                 (ushort)(SUB111(auVar5 >> 7,0) & 1) << 5 |
                 (ushort)((byte)(CONCAT19(bVar23,CONCAT18(cVar22,CONCAT17(cVar21,CONCAT16(cVar20,
                                                  CONCAT15(cVar19,CONCAT14(cVar18,CONCAT13(cVar17,
                                                  CONCAT12(cVar16,CONCAT11(cVar15,cVar14))))))))) >>
                                7) & 1) << 6 |
                 (ushort)((byte)(CONCAT18(bVar23,CONCAT17(cVar22,CONCAT16(cVar21,CONCAT15(cVar20,
                                                  CONCAT14(cVar19,CONCAT13(cVar18,CONCAT12(cVar17,
                                                  CONCAT11(cVar16,cVar15)))))))) >> 7) & 1) << 7 |
                (ushort)(bVar23 >> 7) << 0xf) == 0xffff) goto LAB_001b3e14;
    func_obj.tag._0_4_ = in_stack_ffffffffffffff80;
    func_obj.u = (JSValueUnion)in_stack_ffffffffffffff78;
    func_obj.tag._4_4_ = in_stack_ffffffffffffff84;
    this_obj.tag = in_stack_ffffffffffffff70;
    this_obj.u.float64 = 1.48219693752374e-323;
    JVar35 = JS_Call((JSContext *)((ulong)in_stack_ffffffffffffff64 << 0x20),func_obj,this_obj,
                     in_stack_ffffffffffffff5c,in_stack_ffffffffffffffa0);
    iVar36 = (int)JVar35.tag;
    local_68 = JVar35.u._0_4_;
    iVar9 = JS_IsException(JVar35);
    if (iVar9 != 0) {
LAB_001b3e54:
      *(undefined4 *)(in_RDX + 8) = 1;
      return 0;
    }
    if (iVar36 == 0) {
      iVar9 = (uint)(0 < local_68) - (uint)(local_68 < 0);
    }
    else {
      iVar9 = JS_ToFloat64Free(in_stack_ffffffffffffff38,(double *)in_stack_ffffffffffffff30.ptr,
                               in_stack_ffffffffffffff40);
      if (iVar9 < 0) goto LAB_001b3e54;
      uVar3 = CONCAT13(cVar27,CONCAT12(cVar26,CONCAT11(cVar25,cVar24))) ^
              CONCAT13(cVar27,CONCAT12(cVar26,CONCAT11(cVar25,cVar24)));
      uVar4 = CONCAT13(cVar33,CONCAT12(cVar31,CONCAT11(cVar29,cVar28))) ^
              CONCAT13(cVar33,CONCAT12(cVar31,CONCAT11(cVar29,cVar28)));
      uVar30 = (undefined1)(uVar4 >> 8);
      uVar32 = (undefined1)(uVar4 >> 0x10);
      uVar34 = (undefined1)(uVar4 >> 0x18);
      iVar9 = (uint)((double)CONCAT17(uVar34,CONCAT16(uVar32,CONCAT15(uVar30,CONCAT14((char)uVar4,
                                                                                      uVar3)))) <=
                     local_b0 &&
                    local_b0 !=
                    (double)CONCAT17(uVar34,CONCAT16(uVar32,CONCAT15(uVar30,CONCAT14((char)uVar4,
                                                                                     uVar3))))) -
              (uint)(local_b0 < 0.0);
    }
  }
  if (iVar9 != 0) {
    return iVar9;
  }
LAB_001b3e14:
  return (uint)(*(long *)(in_RSI + 0x18) < *(long *)(in_RDI + 0x18)) -
         (uint)(*(long *)(in_RDI + 0x18) < *(long *)(in_RSI + 0x18));
}

Assistant:

static int js_array_cmp_generic(const void *a, const void *b, void *opaque) {
    struct array_sort_context *psc = opaque;
    JSContext *ctx = psc->ctx;
    JSValueConst argv[2];
    JSValue res;
    ValueSlot *ap = (ValueSlot *)(void *)a;
    ValueSlot *bp = (ValueSlot *)(void *)b;
    int cmp;

    if (psc->exception)
        return 0;

    if (psc->has_method) {
        /* custom sort function is specified as returning 0 for identical
         * objects: avoid method call overhead.
         */
        if (!memcmp(&ap->val, &bp->val, sizeof(ap->val)))
            goto cmp_same;
        argv[0] = ap->val;
        argv[1] = bp->val;
        res = JS_Call(ctx, psc->method, JS_UNDEFINED, 2, argv);
        if (JS_IsException(res))
            goto exception;
        if (JS_VALUE_GET_TAG(res) == JS_TAG_INT) {
            int val = JS_VALUE_GET_INT(res);
            cmp = (val > 0) - (val < 0);
        } else {
            double val;
            if (JS_ToFloat64Free(ctx, &val, res) < 0)
                goto exception;
            cmp = (val > 0) - (val < 0);
        }
    } else {
        /* Not supposed to bypass ToString even for identical objects as
         * tested in test262/test/built-ins/Array/prototype/sort/bug_596_1.js
         */
        if (!ap->str) {
            JSValue str = JS_ToString(ctx, ap->val);
            if (JS_IsException(str))
                goto exception;
            ap->str = JS_VALUE_GET_STRING(str);
        }
        if (!bp->str) {
            JSValue str = JS_ToString(ctx, bp->val);
            if (JS_IsException(str))
                goto exception;
            bp->str = JS_VALUE_GET_STRING(str);
        }
        cmp = js_string_compare(ctx, ap->str, bp->str);
    }
    if (cmp != 0)
        return cmp;
cmp_same:
    /* make sort stable: compare array offsets */
    return (ap->pos > bp->pos) - (ap->pos < bp->pos);

exception:
    psc->exception = 1;
    return 0;
}